

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx2.cpp
# Opt level: O1

void __thiscall
ncnn::ConvolutionDepthWise_x86_avx2::create_pipeline(ConvolutionDepthWise_x86_avx2 *this)

{
  Option *in_RSI;
  
  create_pipeline((ConvolutionDepthWise_x86_avx2 *)
                  ((long)&this->_vptr_ConvolutionDepthWise_x86_avx2 +
                  (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-6]),in_RSI);
  return;
}

Assistant:

int ConvolutionDepthWise_x86_avx2::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
        // pack8
        if (elempack == 8)
        {
#if __AVX2__
            if (opt.use_weight_fp16_storage && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                Mat weight_data_r2 = weight_data.reshape(maxk, group);
                Mat weight_data_tmp;
                convert_packing(weight_data_r2, weight_data_tmp, 8, opt);
                ncnn::cast_float32_to_float16(weight_data_tmp, weight_data_packed, opt);
                return 0;
            }
            if (opt.use_weight_fp16_storage && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                Mat weight_data_r2 = weight_data.reshape(maxk, group);
                Mat weight_data_tmp;
                convert_packing(weight_data_r2, weight_data_tmp, 8, opt);
                ncnn::cast_float32_to_float16(weight_data_tmp, weight_data_packed, opt);
                return 0;
            }
#endif
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_packed, 8, opt);

            return 0;
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_packed, 4, opt);

            return 0;
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            // depth-wise specific
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                return 0;
            }
        }
    }

    // group convolution
    create_group_ops(opt);

    return 0;
}